

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

MutableSubtree ts_subtree_make_mut(SubtreePool *pool,Subtree self)

{
  ushort uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  uint32_t uVar6;
  TSStateId TVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  SubtreeHeapData *pSVar11;
  Subtree *__dest;
  ulong uVar12;
  MutableSubtree MVar13;
  SubtreeHeapData *pSVar14;
  undefined2 *puVar15;
  ushort *puVar16;
  MutableSubtree MVar17;
  MutableSubtree MVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  ulong extraout_RDX;
  uint uVar22;
  uint uVar23;
  Subtree SVar24;
  ulong *puVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  uint32_t i;
  ulong uVar33;
  int iVar34;
  int iVar35;
  ulong uVar36;
  int iVar37;
  byte bVar38;
  uint uStack_f4;
  uint uStack_f0;
  int iStack_dc;
  undefined4 uStack_c4;
  int iStack_b4;
  anon_union_24_2_84168a9f_for_ExternalScannerState_0 local_50;
  undefined8 uStack_38;
  
  bVar38 = 0;
  if (((ulong)self.ptr & 1) != 0) {
    return (MutableSubtree)self.data;
  }
  if ((self.ptr)->ref_count == 1) {
    return (MutableSubtree)self.data;
  }
  pSVar11 = ts_subtree_pool_allocate(pool);
  SVar24 = self;
  pSVar14 = pSVar11;
  for (lVar19 = 0xb; lVar19 != 0; lVar19 = lVar19 + -1) {
    uVar6 = ((Length *)((long)SVar24 + 4))->bytes;
    pSVar14->ref_count = *(uint32_t *)SVar24;
    (pSVar14->padding).bytes = uVar6;
    SVar24.data = SVar24.data + (ulong)bVar38 * -0x10 + 8;
    pSVar14 = (SubtreeHeapData *)((long)pSVar14 + (ulong)bVar38 * -0x10 + 8);
  }
  uVar30 = pSVar11->child_count;
  if ((ulong)uVar30 == 0) {
    if ((pSVar11->field_0x2c & 0x40) != 0) {
      ts_external_scanner_state_copy
                ((ExternalScannerState *)&local_50,&((self.ptr)->field_17).external_scanner_state);
      *(undefined8 *)((long)&pSVar11->field_17 + 0x10) = local_50._16_8_;
      *(undefined8 *)((long)&pSVar11->field_17 + 0x18) = uStack_38;
      (pSVar11->field_17).field_0.children = (Subtree *)local_50.long_data;
      *(undefined8 *)((long)&pSVar11->field_17 + 8) = local_50._8_8_;
    }
LAB_00132d8d:
    pSVar11->ref_count = 1;
    ts_subtree_release(pool,self);
    return (MutableSubtree)pSVar11;
  }
  uVar33 = (ulong)(self.ptr)->child_count;
  puVar25 = (ulong *)&DAT_00000008;
  __dest = (Subtree *)calloc(uVar33,8);
  lVar19 = CONCAT71((int7)((ulong)lVar19 >> 8),__dest != (Subtree *)0x0 || uVar33 == 0);
  if (__dest != (Subtree *)0x0 || uVar33 == 0) {
    (pSVar11->field_17).field_0.children = __dest;
    memcpy(__dest,((self.ptr)->field_17).field_0.children,(ulong)uVar30 << 3);
    uVar33 = 0;
    do {
      ts_subtree_retain((pSVar11->field_17).field_0.children[uVar33]);
      uVar33 = uVar33 + 1;
    } while (uVar33 < pSVar11->child_count);
    goto LAB_00132d8d;
  }
  ts_subtree_make_mut_cold_1();
  if ((uVar33 & 1) != 0) {
    __assert_fail("!self.data.is_inline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/subtree.c"
                  ,0x15b,
                  "void ts_subtree_set_children(MutableSubtree, Subtree *, uint32_t, const TSLanguage *)"
                 );
  }
  if ((*(int *)(uVar33 + 0x24) != 0) && (*(ulong **)(uVar33 + 0x30) != puVar25)) {
    free(*(ulong **)(uVar33 + 0x30));
  }
  iVar35 = (int)extraout_RDX;
  *(int *)(uVar33 + 0x24) = iVar35;
  *(ulong **)(uVar33 + 0x30) = puVar25;
  lVar20 = 0;
  *(undefined4 *)(uVar33 + 0x20) = 0;
  *(undefined8 *)(uVar33 + 0x38) = 0;
  *(undefined8 *)(uVar33 + 0x40) = 1;
  uStack_f4 = *(ushort *)(uVar33 + 0x2c) & 0xffffffbf;
  *(short *)(uVar33 + 0x2c) = (short)uStack_f4;
  *(undefined4 *)(uVar33 + 0x48) = 0;
  TVar7 = TS_TREE_STATE_NONE;
  if ((ulong)*(ushort *)(uVar33 + 0x4c) != 0) {
    lVar20 = (ulong)*(ushort *)(lVar19 + 0x48) * (ulong)*(ushort *)(uVar33 + 0x4c) * 2 +
             *(long *)(lVar19 + 0x40);
  }
  if (iVar35 == 0) {
    iVar29 = *(int *)(uVar33 + 0x10);
    iVar8 = *(int *)(uVar33 + 4) + iVar29;
    iVar21 = 0;
    uStack_f0 = 0;
  }
  else {
    iVar28 = 1;
    iVar10 = 0;
    iVar34 = 0;
    iStack_dc = 0;
    iVar21 = 0;
    uVar36 = 0;
    uVar27 = 0;
    uStack_f0 = 0;
    do {
      uVar3 = puVar25[uVar36];
      uVar22 = (uint)(uVar3 >> 0x20);
      uVar30 = (uint)(uVar3 >> 0x10);
      if (uVar36 == 0) {
        if ((uVar3 & 1) != 0) {
          uVar30 = uVar30 & 0xff;
          *(ulong *)(uVar33 + 4) = uVar3 >> 8 & 0xf00000000 | (ulong)uVar30;
          *(uint *)(uVar33 + 0xc) = uVar22 & 0xff;
          uVar12 = uVar3 >> 0x18 & 0xff;
          *(ulong *)(uVar33 + 0x10) = uVar12;
          *(int *)(uVar33 + 0x18) = (int)uVar12;
          iVar8 = uVar30 + (int)uVar12;
          goto LAB_00133021;
        }
        uVar4 = *(undefined8 *)(uVar3 + 4);
        uVar2 = *(undefined4 *)(uVar3 + 0xc);
        *(undefined8 *)(uVar33 + 4) = uVar4;
        *(undefined4 *)(uVar33 + 0xc) = uVar2;
        uVar12 = *(ulong *)(uVar3 + 0x10);
        uVar2 = *(undefined4 *)(uVar3 + 0x18);
        *(ulong *)(uVar33 + 0x10) = uVar12;
        *(undefined4 *)(uVar33 + 0x18) = uVar2;
        iVar8 = (int)uVar4 + (int)uVar12;
LAB_0013307a:
        iVar29 = (int)uVar12;
        uVar30 = *(int *)(uVar3 + 0x1c) + iVar8;
        if (uStack_f0 < uVar30) {
          uStack_f0 = uVar30;
        }
        if (*(short *)(uVar3 + 0x28) != -2) {
          iVar9 = 0x262;
          if ((*(byte *)(uVar3 + 0x2c) & 0x80) == 0) {
            iVar9 = *(int *)(uVar3 + 0x20);
          }
          iVar21 = iVar21 + iVar9;
          *(int *)(uVar33 + 0x20) = iVar21;
        }
        if (*(int *)(uVar3 + 0x24) == 0) {
          iVar9 = 0;
        }
        else {
          iVar9 = *(int *)(uVar3 + 0x48);
        }
        iStack_dc = iStack_dc + iVar9;
        *(int *)(uVar33 + 0x48) = iStack_dc;
        if (*(int *)(uVar3 + 0x24) == 0) {
          iVar37 = 1;
        }
        else {
          iVar37 = *(int *)(uVar3 + 0x40);
        }
        bVar5 = false;
      }
      else {
        if ((uVar3 & 1) == 0) {
          uVar12 = *(ulong *)(uVar3 + 4);
          uVar23 = *(uint *)(uVar3 + 0xc);
          uVar32 = *(ulong *)(uVar3 + 0x10);
          iVar29 = (int)(uVar32 >> 0x20);
          uVar30 = *(uint *)(uVar3 + 0x18);
        }
        else {
          uVar23 = uVar22 & 0xff;
          uVar12 = uVar3 >> 8 & 0xf00000000 | (ulong)(uVar30 & 0xff);
          uVar32 = uVar3 >> 0x18 & 0xff;
          uVar30 = (uint)uVar32;
          iVar29 = 0;
        }
        uStack_c4 = (undefined4)(uVar12 >> 0x20);
        uVar26 = CONCAT44(uVar23,uStack_c4) + CONCAT44(uVar30,iVar29);
        uVar31 = uVar26 & 0xffffffff | (ulong)uVar30 << 0x20;
        if (iVar29 == 0) {
          uVar31 = uVar26;
        }
        iStack_b4 = (int)uVar31;
        uStack_c4 = (undefined4)((ulong)*(undefined8 *)(uVar33 + 0x10) >> 0x20);
        iVar8 = (int)uVar12 + (int)uVar32 + (int)*(undefined8 *)(uVar33 + 0x10);
        uVar12 = CONCAT44(*(undefined4 *)(uVar33 + 0x18),uStack_c4) + uVar31;
        uVar32 = uVar12 & 0xffffffff | uVar31 & 0xffffffff00000000;
        if (iStack_b4 == 0) {
          uVar32 = uVar12;
        }
        iStack_b4 = (int)uVar32;
        uVar12 = CONCAT44(iStack_b4,iVar8);
        *(ulong *)(uVar33 + 0x10) = uVar12;
        *(int *)(uVar33 + 0x18) = (int)(uVar32 >> 0x20);
        iVar8 = *(int *)(uVar33 + 4) + iVar8;
        if ((uVar3 & 1) == 0) goto LAB_0013307a;
LAB_00133021:
        iVar29 = (int)uVar12;
        uVar30 = (uVar22 >> 0xc & 0xf) + iVar8;
        if (uVar30 <= uStack_f0) {
          uVar30 = uStack_f0;
        }
        iVar9 = iVar21 + 0x262;
        if ((uVar3 & 0x20) == 0) {
          iVar9 = iVar21;
        }
        *(int *)(uVar33 + 0x20) = iVar9;
        iVar37 = 1;
        bVar5 = true;
        uStack_f0 = uVar30;
        iVar21 = iVar9;
      }
      iVar28 = iVar28 + iVar37;
      *(int *)(uVar33 + 0x40) = iVar28;
      if ((lVar20 == 0) || (*(short *)(lVar20 + uVar27 * 2) == 0)) {
LAB_0013310a:
        if (bVar5) {
          if ((uVar3 & 2) != 0) {
            *(int *)(uVar33 + 0x38) = iVar34 + 1;
            if ((uVar3 & 4) == 0) goto joined_r0x001331e4;
            iVar10 = iVar10 + 1;
            *(int *)(uVar33 + 0x3c) = iVar10;
            iVar34 = iVar34 + 1;
          }
          goto LAB_001331c2;
        }
        if ((*(byte *)(uVar3 + 0x2c) & 1) == 0) {
          if (*(int *)(uVar3 + 0x24) != 0) {
            iVar34 = iVar34 + *(int *)(uVar3 + 0x38);
            *(int *)(uVar33 + 0x38) = iVar34;
            iVar9 = *(int *)(uVar3 + 0x3c);
LAB_00133173:
            iVar10 = iVar10 + iVar9;
            *(int *)(uVar33 + 0x3c) = iVar10;
          }
        }
        else {
          iVar34 = iVar34 + 1;
          *(int *)(uVar33 + 0x38) = iVar34;
          iVar9 = 1;
          if ((*(byte *)(uVar3 + 0x2c) & 2) != 0) goto LAB_00133173;
        }
LAB_001331e6:
        if ((*(byte *)(uVar3 + 0x2c) & 0x40) != 0) {
          uStack_f4 = uStack_f4 | 0x40;
          *(short *)(uVar33 + 0x2c) = (short)uStack_f4;
        }
        if (*(short *)(uVar3 + 0x28) == -1) {
          uStack_f4 = uStack_f4 | 0x18;
          *(short *)(uVar33 + 0x2c) = (short)uStack_f4;
          *(TSStateId *)(uVar33 + 0x2a) = TVar7;
        }
        uVar30 = *(uint *)(uVar3 + 0x2c) >> 2;
      }
      else {
        if (bVar5) {
          uVar30 = (uint)(uVar3 >> 3) & 0x1fffffff;
        }
        else {
          uVar30 = *(uint *)(uVar3 + 0x2c) >> 2;
        }
        if ((uVar30 & 1) != 0) goto LAB_0013310a;
        *(int *)(uVar33 + 0x38) = iVar34 + 1;
        uVar1 = *(ushort *)(lVar20 + uVar27 * 2);
        if ((uVar1 != 0xfffe) &&
           ((uVar1 == 0xffff || ((*(byte *)(*(long *)(lVar19 + 0x20) + (ulong)uVar1) & 2) != 0)))) {
          iVar10 = iVar10 + 1;
          *(int *)(uVar33 + 0x3c) = iVar10;
        }
joined_r0x001331e4:
        iVar34 = iVar34 + 1;
        if (!bVar5) goto LAB_001331e6;
LAB_001331c2:
        uVar30 = (uint)uVar3 >> 3;
      }
      uVar27 = (ulong)((int)uVar27 + (uint)((uVar30 & 1) == 0));
      uVar36 = uVar36 + 1;
    } while ((extraout_RDX & 0xffffffff) != uVar36);
  }
  MVar13._0_4_ = uStack_f0 - iVar8;
  MVar13._4_4_ = 0;
  *(uint *)(uVar33 + 0x1c) = MVar13._0_4_;
  uVar1 = *(ushort *)(uVar33 + 0x28);
  if (0xfffd < uVar1) {
    MVar13._0_4_ = iVar21 + iVar29 + *(int *)(uVar33 + 0x14) * 0x1e + 500;
    MVar13._4_4_ = 0;
    *(uint *)(uVar33 + 0x20) = MVar13._0_4_;
    if (iVar35 == 0) {
      return (MutableSubtree)MVar13.data;
    }
    uVar27 = 0;
    do {
      uVar36 = puVar25[uVar27];
      if ((uVar36 & 1) == 0) {
        if (((*(ushort *)(uVar36 + 0x2c) & 4) == 0) &&
           (*(short *)(uVar36 + 0x28) != -1 || *(int *)(uVar36 + 0x24) != 0)) {
          iVar29 = 100;
          if ((*(ushort *)(uVar36 + 0x2c) & 1) == 0) {
            if (*(int *)(uVar36 + 0x24) == 0) goto LAB_001332d5;
            iVar29 = *(int *)(uVar36 + 0x38) * 100;
          }
LAB_001332a9:
          MVar13._0_4_ = MVar13._0_4_ + iVar29;
          MVar13._4_4_ = 0;
          *(uint *)(uVar33 + 0x20) = MVar13._0_4_;
        }
      }
      else {
        iVar29 = 100;
        if (((uint)uVar36 & 10) == 2) goto LAB_001332a9;
      }
LAB_001332d5:
      uVar27 = uVar27 + 1;
    } while ((extraout_RDX & 0xffffffff) != uVar27);
  }
  if (iVar35 == 0) {
    return (MutableSubtree)MVar13.ptr;
  }
  uVar27 = *puVar25;
  uVar36 = puVar25[iVar35 - 1];
  bVar38 = (byte)(uVar27 >> 8);
  if ((uVar27 & 1) == 0) {
    puVar15 = (undefined2 *)(uVar27 + 0x4e);
    if (*(int *)(uVar27 + 0x24) == 0) {
      puVar15 = (undefined2 *)(uVar27 + 0x28);
    }
    *(undefined2 *)(uVar33 + 0x4e) = *puVar15;
    puVar16 = (ushort *)(uVar27 + 0x50);
    if (*(int *)(uVar27 + 0x24) == 0) {
      puVar16 = (ushort *)(uVar27 + 0x2a);
    }
    pSVar14 = (SubtreeHeapData *)(ulong)*puVar16;
    *(ushort *)(uVar33 + 0x50) = *puVar16;
    if ((*(byte *)(uVar27 + 0x2c) & 8) != 0) {
      uStack_f4 = uStack_f4 | 8;
      pSVar14 = (SubtreeHeapData *)(ulong)uStack_f4;
      *(short *)(uVar33 + 0x2c) = (short)uStack_f4;
    }
  }
  else {
    *(ushort *)(uVar33 + 0x4e) = (ushort)bVar38;
    pSVar14 = (SubtreeHeapData *)(uVar27 >> 0x30);
    *(short *)(uVar33 + 0x50) = (short)(uVar27 >> 0x30);
  }
  if (((uVar36 & 1) == 0) && ((*(byte *)(uVar36 + 0x2c) & 0x10) != 0)) {
    uStack_f4 = uStack_f4 | 0x10;
    pSVar14 = (SubtreeHeapData *)(ulong)uStack_f4;
    *(short *)(uVar33 + 0x2c) = (short)uStack_f4;
  }
  if (iVar35 == 1) {
    return (MutableSubtree)pSVar14;
  }
  uStack_f4 = uStack_f4 >> 1 | uStack_f4;
  if ((uStack_f4 & 1) != 0) {
    return (MutableSubtree)(SubtreeHeapData *)(ulong)uStack_f4;
  }
  if ((uVar27 & 1) == 0) {
    if (*(ushort *)(uVar27 + 0x28) != uVar1) {
      return (MutableSubtree)(SubtreeHeapData *)(ulong)uStack_f4;
    }
    if (*(int *)(uVar27 + 0x24) == 0) goto LAB_001333b8;
    uVar30 = *(uint *)(uVar27 + 0x44);
  }
  else {
    MVar17._1_7_ = 0;
    MVar17._0_1_ = bVar38;
    if (bVar38 != uVar1) {
      return (MutableSubtree)MVar17.ptr;
    }
LAB_001333b8:
    uVar30 = 0;
  }
  if (((uVar36 & 1) == 0) && (*(int *)(uVar36 + 0x24) != 0)) {
    if (*(uint *)(uVar36 + 0x44) < uVar30) {
      MVar18 = (MutableSubtree)0x1;
      if ((uVar27 & 1) != 0) goto LAB_001333f6;
      goto LAB_001333e8;
    }
  }
  else {
    MVar18 = (MutableSubtree)0x1;
    if (uVar30 == 0 || (uVar27 & 1) != 0) goto LAB_001333f6;
LAB_001333e8:
    MVar18 = (MutableSubtree)0x1;
    uVar36 = uVar27;
    if (*(int *)(uVar27 + 0x24) == 0) goto LAB_001333f6;
  }
  MVar18._0_4_ = *(int *)(uVar36 + 0x44) + 1;
  MVar18._4_4_ = 0;
LAB_001333f6:
  *(int *)(uVar33 + 0x44) = MVar18._0_4_;
  return (MutableSubtree)MVar18.ptr;
}

Assistant:

MutableSubtree ts_subtree_make_mut(SubtreePool *pool, Subtree self) {
  if (self.data.is_inline) return (MutableSubtree) {self.data};
  if (self.ptr->ref_count == 1) return ts_subtree_to_mut_unsafe(self);

  SubtreeHeapData *result = ts_subtree_pool_allocate(pool);
  memcpy(result, self.ptr, sizeof(SubtreeHeapData));
  if (result->child_count > 0) {
    result->children = ts_calloc(self.ptr->child_count, sizeof(Subtree));
    memcpy(result->children, self.ptr->children, result->child_count * sizeof(Subtree));
    for (uint32_t i = 0; i < result->child_count; i++) {
      ts_subtree_retain(result->children[i]);
    }
  } else if (result->has_external_tokens) {
    result->external_scanner_state = ts_external_scanner_state_copy(&self.ptr->external_scanner_state);
  }
  result->ref_count = 1;
  ts_subtree_release(pool, self);
  return (MutableSubtree) {.ptr = result};
}